

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

AActor * AActor::StaticSpawn(PClassActor *type,DVector3 *pos,replace_t allowreplacement,
                            bool SpawningMapThing)

{
  sector_t *psVar1;
  AActor *this;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  MetaClass *pMVar6;
  FStrifeDialogueNode **ppFVar7;
  ActorRenderFlags *other;
  double dVar8;
  double dVar9;
  FRandom *local_d0;
  TFlags<ActorFlag5,_unsigned_int> local_c8;
  TFlags<ActorFlag,_unsigned_int> local_c4;
  Self local_c0;
  TFlags<ActorFlag2,_unsigned_int> local_bc;
  double local_b8;
  double space;
  int local_a8;
  TFlags<ActorFlag5,_unsigned_int> local_a4;
  int local_a0;
  int local_9c;
  TVector2<double> local_98;
  TVector2<double> local_88;
  TFlags<ActorRenderFlag,_unsigned_int> local_78;
  undefined1 local_74 [4];
  TFlags<ActorRenderFlag,_unsigned_int> local_70;
  TFlags<ActorRenderFlag,_unsigned_int> local_6c;
  FState *local_68;
  FState *st;
  FRandom *local_58;
  FRandom *rng;
  FName local_34;
  AActor *local_30;
  AActor *actor;
  bool SpawningMapThing_local;
  DVector3 *pDStack_20;
  replace_t allowreplacement_local;
  DVector3 *pos_local;
  PClassActor *type_local;
  
  actor._3_1_ = SpawningMapThing;
  actor._4_4_ = allowreplacement;
  pDStack_20 = pos;
  pos_local = (DVector3 *)type;
  if (type == (PClassActor *)0x0) {
    I_Error("Tried to spawn a class-less actor\n");
  }
  if (actor._4_4_ != NO_REPLACE) {
    pos_local = (DVector3 *)PClassActor::GetReplacement((PClassActor *)pos_local,true);
  }
  local_30 = (AActor *)PClass::CreateNew((PClass *)pos_local);
  pMVar6 = GetClass(local_30);
  FName::FName(&local_34,
               &(pMVar6->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName);
  iVar4 = GetConversation(&local_34);
  local_30->ConversationRoot = iVar4;
  if (local_30->ConversationRoot == -1) {
    local_30->Conversation = (FStrifeDialogueNode *)0x0;
  }
  else {
    ppFVar7 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::operator[]
                        (&StrifeDialogues,(long)local_30->ConversationRoot);
    local_30->Conversation = *ppFVar7;
  }
  SetXYZ(local_30,pDStack_20);
  TVector3<double>::TVector3
            ((TVector3<double> *)&rng,3.4028234663852886e+38,3.4028234663852886e+38,
             3.4028234663852886e+38);
  TVector3<double>::operator=(&local_30->OldRenderPos,(TVector3<double> *)&rng);
  FTextureID::SetInvalid(&local_30->picnum);
  iVar4 = SpawnHealth(local_30);
  local_30->health = iVar4;
  if ((local_30->Gravity == 0.0) && (!NAN(local_30->Gravity))) {
    TFlags<ActorFlag,_unsigned_int>::operator|=(&local_30->flags,MF_NOGRAVITY);
  }
  if ((bglobal.m_Thinking & 1U) == 0) {
    local_d0 = &pr_spawnmobj;
  }
  else {
    local_d0 = &pr_botspawnmobj;
  }
  local_58 = local_d0;
  bVar2 = isFast(local_30);
  bVar3 = false;
  if (bVar2) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              ((TFlags<ActorFlag3,_unsigned_int> *)((long)&st + 4),
               (int)local_30 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&st + 4));
    bVar3 = uVar5 != 0;
  }
  if (bVar3) {
    local_30->reactiontime = 0;
  }
  TFlags<ActorFlag3,_unsigned_int>::operator&
            ((TFlags<ActorFlag3,_unsigned_int> *)&st,
             (int)local_30 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
  uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&st);
  if (uVar5 != 0) {
    iVar4 = FRandom::operator()(local_58);
    local_30->LastLookPlayerNumber = (SBYTE)(iVar4 % 8);
    local_30->TIDtoHate = 0;
  }
  local_68 = local_30->SpawnState;
  local_30->state = local_68;
  iVar4 = FState::GetTics(local_68);
  local_30->tics = iVar4;
  local_30->sprite = local_68->sprite;
  iVar4 = FState::GetFrame(local_68);
  local_30->frame = (BYTE)iVar4;
  other = &local_30->renderflags;
  operator~((EnumType)local_74);
  TFlags<ActorRenderFlag,_unsigned_int>::operator&(&local_70,other);
  uVar5 = FState::GetFullbright(local_68);
  TFlags<ActorRenderFlag,_unsigned_int>::FromInt(&local_78,uVar5);
  TFlags<ActorRenderFlag,_unsigned_int>::operator|(&local_6c,&local_70);
  TFlags<ActorRenderFlag,_unsigned_int>::operator=(&local_30->renderflags,&local_6c);
  local_30->touching_sectorlist = (msecnode_t *)0x0;
  local_30->touching_rendersectors = (msecnode_t *)0x0;
  iVar4 = G_SkillProperty(SKILLP_FastMonsters);
  if ((iVar4 != 0) && (pMVar6 = GetClass(local_30), 0.0 <= pMVar6->FastSpeed)) {
    pMVar6 = GetClass(local_30);
    local_30->Speed = pMVar6->FastSpeed;
  }
  LinkToWorld(local_30,(FLinkContext *)0x0,(bool)(actor._3_1_ & 1),(sector_t *)0x0);
  ClearInterpolation(local_30);
  psVar1 = local_30->Sector;
  TVector2<double>::TVector2(&local_88,pDStack_20);
  dVar8 = secplane_t::ZatPoint(&psVar1->floorplane,&local_88);
  local_30->floorz = dVar8;
  local_30->dropoffz = dVar8;
  psVar1 = local_30->Sector;
  TVector2<double>::TVector2(&local_98,pDStack_20);
  dVar8 = secplane_t::ZatPoint(&psVar1->ceilingplane,&local_98);
  local_30->ceilingz = dVar8;
  if (((pDStack_20->Z == -2147483648.0) && (!NAN(pDStack_20->Z))) ||
     ((pDStack_20->Z == 2147483646.0 && (!NAN(pDStack_20->Z))))) {
    SetZ(local_30,local_30->floorz,true);
  }
  else if ((pDStack_20->Z == 2147483647.0) && (!NAN(pDStack_20->Z))) {
    SetZ(local_30,local_30->ceilingz - local_30->Height,true);
  }
  if (((actor._3_1_ & 1) == 0) &&
     (bVar3 = PClass::IsDescendantOf((PClass *)pos_local,APlayerPawn::RegistrationInfo.MyClass),
     bVar3)) {
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_a4,
               (int)local_30 +
               (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
    uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_a4);
    if (uVar5 == 0) {
      P_FindFloorCeiling(local_30,0);
    }
    else {
      local_a8 = (int)sector_t::GetTexture(local_30->Sector,0);
      (local_30->floorpic).texnum = local_a8;
      iVar4 = sector_t::GetTerrain(local_30->Sector,0);
      local_30->floorterrain = iVar4;
      local_30->floorsector = local_30->Sector;
      space._4_4_ = sector_t::GetTexture(local_30->Sector,1);
      (local_30->ceilingpic).texnum = space._4_4_;
      local_30->ceilingsector = local_30->Sector;
    }
  }
  else if ((actor._3_1_ & 1) == 0) {
    P_FindFloorCeiling(local_30,1);
  }
  else {
    local_30->floorsector = local_30->Sector;
    local_9c = (int)sector_t::GetTexture(local_30->floorsector,0);
    (local_30->floorpic).texnum = local_9c;
    iVar4 = sector_t::GetTerrain(local_30->floorsector,0);
    local_30->floorterrain = iVar4;
    local_30->ceilingsector = local_30->Sector;
    local_a0 = (int)sector_t::GetTexture(local_30->ceilingsector,1);
    (local_30->ceilingpic).texnum = local_a0;
  }
  this = local_30;
  (local_30->SpawnPoint).X = pDStack_20->X;
  (local_30->SpawnPoint).Y = pDStack_20->Y;
  if ((pDStack_20->Z != -2147483648.0) || (NAN(pDStack_20->Z))) {
    if ((pDStack_20->Z != 2147483647.0) || (NAN(pDStack_20->Z))) {
      if ((pDStack_20->Z != 2147483646.0) || (NAN(pDStack_20->Z))) {
        dVar8 = Z(local_30);
        dVar9 = secplane_t::ZatPoint(&local_30->Sector->floorplane,local_30);
        (local_30->SpawnPoint).Z = dVar8 - dVar9;
      }
      else {
        local_b8 = (local_30->ceilingz - local_30->Height) - local_30->floorz;
        if (local_b8 <= 48.0) {
          SetZ(local_30,local_30->floorz,true);
        }
        else {
          dVar8 = local_b8 - 40.0;
          local_b8 = dVar8;
          iVar4 = FRandom::operator()(local_58);
          SetZ(this,(dVar8 * (double)iVar4) / 256.0 + local_30->floorz + 40.0,true);
        }
      }
    }
    else {
      SetZ(local_30,local_30->ceilingz - local_30->Height,true);
    }
  }
  else {
    SetZ(local_30,local_30->floorz,true);
  }
  if (local_30->FloatBobPhase == 0xff) {
    iVar4 = FRandom::operator()(local_58);
    local_30->FloatBobPhase = (BYTE)iVar4;
  }
  TFlags<ActorFlag2,_unsigned_int>::operator&
            (&local_bc,(int)local_30 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
  uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_bc);
  if (uVar5 == 0) {
    local_30->Floorclip = 0.0;
  }
  else {
    AdjustFloorClip(local_30);
  }
  (*(local_30->super_DThinker).super_DObject._vptr_DObject[0x19])(local_30,0);
  if (((actor._3_1_ & 1) == 0) &&
     (CallBeginPlay(local_30), ((local_30->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0))
  {
    type_local = (PClassActor *)0x0;
  }
  else {
    if (((::level.flags & 0x20000000) != 0) && (local_30->player == (player_t *)0x0)) {
      operator~((EnumType)&local_c0);
      TFlags<ActorFlag,_unsigned_int>::operator&=(&local_30->flags,&local_c0);
    }
    bVar3 = CountsAsKill(local_30);
    if (bVar3) {
      ::level.total_monsters = ::level.total_monsters + 1;
    }
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_c4,
               (int)local_30 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_c4);
    if (uVar5 != 0) {
      ::level.total_items = ::level.total_items + 1;
    }
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_c8,
               (int)local_30 +
               (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
    uVar5 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_c8);
    if (uVar5 != 0) {
      ::level.total_secrets = ::level.total_secrets + 1;
    }
    type_local = (PClassActor *)local_30;
  }
  return (AActor *)type_local;
}

Assistant:

AActor *AActor::StaticSpawn (PClassActor *type, const DVector3 &pos, replace_t allowreplacement, bool SpawningMapThing)
{
	if (type == NULL)
	{
		I_Error ("Tried to spawn a class-less actor\n");
	}

	if (allowreplacement)
	{
		type = type->GetReplacement();
	}

	AActor *actor;
	
	actor = static_cast<AActor *>(const_cast<PClassActor *>(type)->CreateNew ());

	// Set default dialogue
	actor->ConversationRoot = GetConversation(actor->GetClass()->TypeName);
	if (actor->ConversationRoot != -1)
	{
		actor->Conversation = StrifeDialogues[actor->ConversationRoot];
	}
	else
	{
		actor->Conversation = NULL;
	}

	actor->SetXYZ(pos);
	actor->OldRenderPos = { FLT_MAX, FLT_MAX, FLT_MAX };
	actor->picnum.SetInvalid();
	actor->health = actor->SpawnHealth();

	// Actors with zero gravity need the NOGRAVITY flag set.
	if (actor->Gravity == 0) actor->flags |= MF_NOGRAVITY;

	FRandom &rng = bglobal.m_Thinking ? pr_botspawnmobj : pr_spawnmobj;

	if (actor->isFast() && actor->flags3 & MF3_ISMONSTER)
		actor->reactiontime = 0;

	if (actor->flags3 & MF3_ISMONSTER)
	{
		actor->LastLookPlayerNumber = rng() % MAXPLAYERS;
		actor->TIDtoHate = 0;
	}

	// Set the state, but do not use SetState, because action
	// routines can't be called yet.  If the spawnstate has an action
	// routine, it will not be called.
	FState *st = actor->SpawnState;
	actor->state = st;
	actor->tics = st->GetTics();
	
	actor->sprite = st->sprite;
	actor->frame = st->GetFrame();
	actor->renderflags = (actor->renderflags & ~RF_FULLBRIGHT) | ActorRenderFlags::FromInt (st->GetFullbright());
	actor->touching_sectorlist = nullptr;	// NULL head of sector list // phares 3/13/98
	actor->touching_rendersectors = nullptr;
	if (G_SkillProperty(SKILLP_FastMonsters) && actor->GetClass()->FastSpeed >= 0)
	actor->Speed = actor->GetClass()->FastSpeed;

	// set subsector and/or block links
	actor->LinkToWorld (nullptr, SpawningMapThing);
	actor->ClearInterpolation();

	actor->dropoffz = actor->floorz = actor->Sector->floorplane.ZatPoint(pos);
	actor->ceilingz = actor->Sector->ceilingplane.ZatPoint(pos);

	// The z-coordinate needs to be set once before calling P_FindFloorCeiling
	// For FLOATRANDZ just use the floor here.
	if (pos.Z == ONFLOORZ || pos.Z == FLOATRANDZ)
	{
		actor->SetZ(actor->floorz);
	}
	else if (pos.Z == ONCEILINGZ)
	{
		actor->SetZ(actor->ceilingz - actor->Height);
	}

	if (SpawningMapThing || !type->IsDescendantOf (RUNTIME_CLASS(APlayerPawn)))
	{
		// Check if there's something solid to stand on between the current position and the
		// current sector's floor. For map spawns this must be delayed until after setting the
		// z-coordinate.
		if (!SpawningMapThing) 
		{
			P_FindFloorCeiling(actor, FFCF_ONLYSPAWNPOS);
		}
		else
		{
			actor->floorsector = actor->Sector;
			actor->floorpic = actor->floorsector->GetTexture(sector_t::floor);
			actor->floorterrain = actor->floorsector->GetTerrain(sector_t::floor);
			actor->ceilingsector = actor->Sector;
			actor->ceilingpic = actor->ceilingsector->GetTexture(sector_t::ceiling);
		}
	}
	else if (!(actor->flags5 & MF5_NOINTERACTION))
	{
		P_FindFloorCeiling (actor);
	}
	else
	{
		actor->floorpic = actor->Sector->GetTexture(sector_t::floor);
		actor->floorterrain = actor->Sector->GetTerrain(sector_t::floor);
		actor->floorsector = actor->Sector;
		actor->ceilingpic = actor->Sector->GetTexture(sector_t::ceiling);
		actor->ceilingsector = actor->Sector;
	}

	actor->SpawnPoint.X = pos.X;
	actor->SpawnPoint.Y = pos.Y;
	// do not copy Z!

	if (pos.Z == ONFLOORZ)
	{
		actor->SetZ(actor->floorz);
	}
	else if (pos.Z == ONCEILINGZ)
	{
		actor->SetZ(actor->ceilingz - actor->Height);
	}
	else if (pos.Z == FLOATRANDZ)
	{
		double space = actor->ceilingz - actor->Height - actor->floorz;
		if (space > 48)
		{
			space -= 40;
			actor->SetZ( space * rng() / 256. + actor->floorz + 40);
		}
		else
		{
			actor->SetZ(actor->floorz);
		}
	}
	else
	{
		actor->SpawnPoint.Z = (actor->Z() - actor->Sector->floorplane.ZatPoint(actor));
	}

	if (actor->FloatBobPhase == (BYTE)-1) actor->FloatBobPhase = rng();	// Don't make everything bob in sync (unless deliberately told to do)
	if (actor->flags2 & MF2_FLOORCLIP)
	{
		actor->AdjustFloorClip ();
	}
	else
	{
		actor->Floorclip = 0;
	}
	actor->UpdateWaterLevel (false);
	if (!SpawningMapThing)
	{
		actor->CallBeginPlay ();
		if (actor->ObjectFlags & OF_EuthanizeMe)
		{
			return NULL;
		}
	}
	if (level.flags & LEVEL_NOALLIES && !actor->player)
	{
		actor->flags &= ~MF_FRIENDLY;
	}
	// [RH] Count monsters whenever they are spawned.
	if (actor->CountsAsKill())
	{
		level.total_monsters++;
	}
	// [RH] Same, for items
	if (actor->flags & MF_COUNTITEM)
	{
		level.total_items++;
	}
	// And for secrets
	if (actor->flags5 & MF5_COUNTSECRET)
	{
		level.total_secrets++;
	}
	return actor;
}